

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

CURLcode Curl_mime_prepare_headers
                   (Curl_easy *data,curl_mimepart *part,char *contenttype,char *disposition,
                   mimestrategy strategy)

{
  char *pcVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  curl_mimepart *local_c8;
  char *local_a8;
  curl_mimepart *local_80;
  curl_mimepart *subpart;
  char *filename;
  char *name;
  char *pcStack_60;
  CURLcode ret;
  char *cte;
  char *customct;
  char *boundary;
  curl_mime *mime;
  char *pcStack_38;
  mimestrategy strategy_local;
  char *disposition_local;
  char *contenttype_local;
  curl_mimepart *part_local;
  Curl_easy *data_local;
  
  boundary = (char *)0x0;
  customct = (char *)0x0;
  pcStack_60 = (char *)0x0;
  name._4_4_ = CURLE_OK;
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    mimesetstate(&part->state,MIMESTATE_CURLHEADERS,(void *)0x0);
  }
  cte = part->mimetype;
  if (cte == (char *)0x0) {
    cte = search_header(part->userheaders,"Content-Type",0xc);
  }
  disposition_local = contenttype;
  if (cte != (char *)0x0) {
    disposition_local = cte;
  }
  if (disposition_local == (char *)0x0) {
    if (part->kind == MIMEKIND_FILE) {
      disposition_local = Curl_mime_contenttype(part->filename);
      if (disposition_local == (char *)0x0) {
        disposition_local = Curl_mime_contenttype(part->data);
      }
      if ((disposition_local == (char *)0x0) && (part->filename != (char *)0x0)) {
        disposition_local = "application/octet-stream";
      }
    }
    else if (part->kind == MIMEKIND_MULTIPART) {
      disposition_local = "multipart/mixed";
    }
    else {
      disposition_local = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    boundary = (char *)part->arg;
    if (boundary != (char *)0x0) {
      customct = boundary + 0x18;
    }
  }
  else if ((((disposition_local != (char *)0x0) && (cte == (char *)0x0)) &&
           (_Var3 = content_type_match(disposition_local,"text/plain",10), _Var3)) &&
          ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))) {
    disposition_local = (char *)0x0;
  }
  pcVar6 = search_header(part->userheaders,"Content-Disposition",0x13);
  if (pcVar6 == (char *)0x0) {
    pcStack_38 = disposition;
    if ((disposition == (char *)0x0) &&
       (((part->filename != (char *)0x0 || (part->name != (char *)0x0)) ||
        ((disposition_local != (char *)0x0 &&
         (iVar4 = curl_strnequal(disposition_local,"multipart/",10), iVar4 == 0)))))) {
      pcStack_38 = "attachment";
    }
    if ((((pcStack_38 != (char *)0x0) &&
         (iVar4 = curl_strequal(pcStack_38,"attachment"), iVar4 != 0)) &&
        (part->name == (char *)0x0)) && (part->filename == (char *)0x0)) {
      pcStack_38 = (char *)0x0;
    }
    if (pcStack_38 != (char *)0x0) {
      filename = (char *)0x0;
      subpart = (curl_mimepart *)0x0;
      if ((part->name != (char *)0x0) &&
         (filename = escape_string(data,part->name,strategy), filename == (char *)0x0)) {
        name._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      if (((name._4_4_ == CURLE_OK) && (part->filename != (char *)0x0)) &&
         (subpart = (curl_mimepart *)escape_string(data,part->filename,strategy),
         subpart == (curl_mimepart *)0x0)) {
        name._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      if (name._4_4_ == CURLE_OK) {
        pcVar6 = "";
        if (filename == (char *)0x0) {
          local_a8 = "";
        }
        else {
          pcVar6 = "; name=\"";
          local_a8 = filename;
        }
        pcVar1 = "PK\x01\x02";
        if (filename != (char *)0x0) {
          pcVar1 = "\n\t\t\t\"";
        }
        pcVar7 = "";
        if (subpart == (curl_mimepart *)0x0) {
          local_c8 = (curl_mimepart *)0x1198ba7;
        }
        else {
          pcVar7 = "; filename=\"";
          local_c8 = subpart;
        }
        pcVar2 = "PK\x01\x02";
        if (subpart != (curl_mimepart *)0x0) {
          pcVar2 = "\n\t\t\t\"";
        }
        name._4_4_ = Curl_mime_add_header
                               (&part->curlheaders,"Content-Disposition: %s%s%s%s%s%s%s",pcStack_38,
                                pcVar6,local_a8,pcVar1 + 4,pcVar7,local_c8,pcVar2 + 4);
      }
      (*Curl_cfree)(filename);
      (*Curl_cfree)(subpart);
      if (name._4_4_ != CURLE_OK) {
        return name._4_4_;
      }
    }
  }
  if ((disposition_local == (char *)0x0) ||
     (name._4_4_ = add_content_type(&part->curlheaders,disposition_local,customct),
     data_local._4_4_ = name._4_4_, name._4_4_ == CURLE_OK)) {
    pcVar6 = search_header(part->userheaders,"Content-Transfer-Encoding",0x19);
    if (pcVar6 == (char *)0x0) {
      if (part->encoder == (mime_encoder *)0x0) {
        if (((disposition_local != (char *)0x0) && (strategy == MIMESTRATEGY_MAIL)) &&
           (part->kind != MIMEKIND_MULTIPART)) {
          pcStack_60 = "8bit";
        }
      }
      else {
        pcStack_60 = part->encoder->name;
      }
      if ((pcStack_60 != (char *)0x0) &&
         (name._4_4_ = Curl_mime_add_header
                                 (&part->curlheaders,"Content-Transfer-Encoding: %s",pcStack_60),
         name._4_4_ != CURLE_OK)) {
        return name._4_4_;
      }
    }
    if ((part->state).state == MIMESTATE_CURLHEADERS) {
      mimesetstate(&part->state,MIMESTATE_CURLHEADERS,part->curlheaders);
    }
    if ((part->kind == MIMEKIND_MULTIPART) && (boundary != (char *)0x0)) {
      pcStack_38 = (char *)0x0;
      _Var3 = content_type_match(disposition_local,"multipart/form-data",0x13);
      if (_Var3) {
        pcStack_38 = "form-data";
      }
      for (local_80 = *(curl_mimepart **)(boundary + 8); local_80 != (curl_mimepart *)0x0;
          local_80 = local_80->nextpart) {
        CVar5 = Curl_mime_prepare_headers(data,local_80,(char *)0x0,pcStack_38,strategy);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        name._4_4_ = CURLE_OK;
      }
    }
    data_local._4_4_ = name._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_mime_prepare_headers(struct Curl_easy *data,
                                   curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(data, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(data, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(data, subpart, NULL,
                                      disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}